

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix2 * matrix2_scalev2(matrix2 *self,vector2 *scale)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = (scale->field_0).v[0];
  dVar2 = (scale->field_0).v[1];
  dVar3 = (self->field_0).m[2];
  dVar4 = (self->field_0).m[0];
  dVar5 = (self->field_0).m[1];
  dVar6 = (self->field_0).m[3];
  (self->field_0).m[0] = dVar4 * dVar1 + dVar3 * 0.0;
  (self->field_0).m[1] = dVar1 * dVar5 + dVar6 * 0.0;
  (self->field_0).m[2] = dVar4 * 0.0 + dVar2 * dVar3;
  (self->field_0).m[3] = dVar5 * 0.0 + dVar2 * dVar6;
  return self;
}

Assistant:

HYPAPI struct matrix2 *matrix2_scalev2(struct matrix2 *self, const struct vector2 *scale)
{
	struct matrix2 scalingMatrix;

	return matrix2_multiply(self,
		matrix2_make_transformation_scalingv2(&scalingMatrix, scale));
}